

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# VTuneChakraProfile.cpp
# Opt level: O0

void VTuneChakraProfile::LogLoopBodyLoadEvent
               (FunctionBody *body,LoopEntryPointInfo *entryPoint,uint16 loopNumber)

{
  uint32 uVar1;
  uint uVar2;
  uint *puVar3;
  Memory *this;
  ptrdiff_t pVar4;
  utf8char_t *obj;
  utf8char_t *utf8Url;
  size_t urlLength;
  size_t len;
  undefined8 local_c8;
  TrackAllocData local_c0;
  utf8char_t *local_98;
  utf8char_t *utf8MethodName;
  size_t cbUtf8MethodName;
  size_t sizeToAdd;
  undefined4 uStack_78;
  charcount_t ccMethodLength;
  size_t methodLength;
  char16 *methodName;
  iJIT_Method_Load methodInfo;
  uint16 loopNumber_local;
  LoopEntryPointInfo *entryPoint_local;
  FunctionBody *body_local;
  
  if (isJitProfilingActive) {
    methodInfo.class_id = 0;
    methodInfo._44_4_ = 0;
    methodInfo.class_file_name = (char *)0x0;
    methodInfo.method_size = 0;
    methodInfo.line_number_size = 0;
    methodInfo.line_number_table = (pLineNumberInfo)0x0;
    methodInfo.method_name = (char *)0x0;
    methodInfo.method_load_address = (void *)0x0;
    methodName = (char16 *)0x0;
    methodInfo.method_id = 0;
    methodInfo._4_4_ = 0;
    methodLength = (size_t)Js::ParseableFunctionInfo::GetExternalDisplayName
                                     (&body->super_ParseableFunctionInfo);
    _uStack_78 = PAL_wcslen((char16_t *)methodLength);
    sizeToAdd._4_4_ = uStack_78;
    sizeToAdd._0_4_ = 0xffffffff;
    puVar3 = min<unsigned_int>((uint *)((long)&sizeToAdd + 4),(uint *)&sizeToAdd);
    sizeToAdd._4_4_ = *puVar3;
    cbUtf8MethodName = 0x12;
    uVar1 = UInt32Math::MulAdd<3u,18u>(sizeToAdd._4_4_);
    utf8MethodName = (utf8char_t *)(ulong)uVar1;
    Memory::TrackAllocData::CreateTrackAllocData
              (&local_c0,(type_info *)&unsigned_char::typeinfo,0,(size_t)utf8MethodName,
               "/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Base/VTuneChakraProfile.cpp"
               ,0x85);
    this = (Memory *)
           Memory::HeapAllocator::TrackAllocInfo(&Memory::HeapAllocator::Instance,&local_c0);
    len = (size_t)Memory::HeapAllocator::NoThrowAlloc;
    local_c8 = 0;
    local_98 = Memory::AllocateArray<Memory::HeapAllocator,unsigned_char,true>
                         (this,(HeapAllocator *)Memory::HeapAllocator::NoThrowAlloc,0,
                          (size_t)utf8MethodName);
    if (local_98 != (uchar *)0x0) {
      uVar2 = iJIT_GetNewMethodID();
      methodName = (char16 *)CONCAT44(methodName._4_4_,uVar2);
      urlLength = utf8::EncodeInto<(utf8::Utf8EncodingKind)0>
                            (local_98,(size_t)utf8MethodName,(char16 *)methodLength,sizeToAdd._4_4_)
      ;
      sprintf_s((char *)(local_98 + urlLength),(long)utf8MethodName - urlLength," %s %d","Loop",
                (ulong)(loopNumber + 1));
      methodInfo._0_8_ = local_98;
      methodInfo.method_name =
           (char *)Js::EntryPointInfo::GetNativeAddress(&entryPoint->super_EntryPointInfo);
      pVar4 = Js::EntryPointInfo::GetCodeSize(&entryPoint->super_EntryPointInfo);
      methodInfo.method_load_address =
           (void *)CONCAT44(methodInfo.method_load_address._4_4_,(int)pVar4);
      utf8Url = (utf8char_t *)0x0;
      obj = GetUrl(body,(size_t *)&utf8Url);
      methodInfo.class_file_name = (char *)obj;
      iJIT_NotifyEvent(iJVM_EVENT_TYPE_METHOD_LOAD_FINISHED,&methodName);
      Output::Trace(ProfilerPhase,L"Loop body load event: %s Loop %d\n",methodLength,
                    (ulong)(loopNumber + 1));
      if (utf8Url != (utf8char_t *)0x0) {
        Memory::DeleteArray<Memory::HeapAllocator,unsigned_char>
                  (&Memory::HeapAllocator::Instance,(size_t)utf8Url,obj);
      }
      Memory::DeleteArray<Memory::HeapAllocator,unsigned_char>
                (&Memory::HeapAllocator::Instance,(size_t)utf8MethodName,local_98);
    }
  }
  return;
}

Assistant:

void VTuneChakraProfile::LogLoopBodyLoadEvent(Js::FunctionBody* body, Js::LoopEntryPointInfo* entryPoint, uint16 loopNumber)
{
#if ENABLE_NATIVE_CODEGEN
    if (isJitProfilingActive)
    {
        iJIT_Method_Load methodInfo;
        memset(&methodInfo, 0, sizeof(iJIT_Method_Load));
        const char16* methodName = body->GetExternalDisplayName();
        size_t methodLength = wcslen(methodName);
        charcount_t ccMethodLength = static_cast<charcount_t>(methodLength);
        ccMethodLength = min(ccMethodLength, UINT_MAX); // Just truncate if it is too big
        constexpr size_t sizeToAdd = /* spaces */ 2 + _countof(LoopStr) + /* size of loop number */ 10 + /*NULL*/ 1;
        size_t cbUtf8MethodName = UInt32Math::MulAdd<3, sizeToAdd>(ccMethodLength);
        utf8char_t* utf8MethodName = HeapNewNoThrowArray(utf8char_t, cbUtf8MethodName);
        if(utf8MethodName)
        {
            methodInfo.method_id = iJIT_GetNewMethodID();
            size_t len = utf8::EncodeInto<utf8::Utf8EncodingKind::Cesu8>(utf8MethodName, cbUtf8MethodName, methodName, ccMethodLength);
            sprintf_s((char*)(utf8MethodName + len), cbUtf8MethodName - len," %s %d", LoopStr, loopNumber + 1);
            methodInfo.method_name = (char*)utf8MethodName;
            methodInfo.method_load_address = (void*)entryPoint->GetNativeAddress();
            methodInfo.method_size = (uint)entryPoint->GetCodeSize();        // Size in memory - Must be exact

            size_t urlLength  = 0;
            utf8char_t* utf8Url = GetUrl(body, &urlLength);
            methodInfo.source_file_name = (char*)utf8Url;

            iJIT_NotifyEvent(iJVM_EVENT_TYPE_METHOD_LOAD_FINISHED, &methodInfo);
            OUTPUT_TRACE(Js::ProfilerPhase, _u("Loop body load event: %s Loop %d\n"), methodName, loopNumber + 1);

            if(urlLength > 0)
            {
                HeapDeleteArray(urlLength, utf8Url);
            }
            HeapDeleteArray(cbUtf8MethodName, utf8MethodName);
        }
    }
#endif
}